

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMessageCommand.cxx
# Opt level: O0

bool __thiscall
cmMessageCommand::InitialPass
          (cmMessageCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args,cmExecutionStatus *param_2)

{
  cmMakefile *pcVar1;
  LogLevel t;
  bool bVar2;
  reference pbVar3;
  cmake *this_00;
  cmMessenger *this_01;
  bool local_242;
  byte local_1e2;
  undefined1 local_1c0 [24];
  cmMessenger *m;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_1a0;
  cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  local_198;
  undefined1 local_188 [8];
  string message;
  LogLevel desiredLevel;
  allocator<char> local_139;
  string local_138;
  allocator<char> local_111;
  string local_110;
  allocator<char> local_e9;
  string local_e8;
  byte local_c3;
  byte local_c2;
  allocator<char> local_c1;
  string local_c0;
  allocator<char> local_99;
  string local_98;
  int local_74;
  byte local_6e;
  byte local_6d;
  LogLevel level;
  bool fatal;
  bool status;
  const_iterator cStack_68;
  MessageType type;
  const_iterator i;
  allocator<char> local_49;
  string local_48;
  cmExecutionStatus *local_28;
  cmExecutionStatus *param_2_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *args_local;
  cmMessageCommand *this_local;
  
  local_28 = param_2;
  param_2_local = (cmExecutionStatus *)args;
  args_local = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)this;
  bVar2 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::empty(args);
  if (bVar2) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_48,"called with incorrect number of arguments",&local_49);
    cmCommand::SetError(&this->super_cmCommand,&local_48);
    std::__cxx11::string::~string((string *)&local_48);
    std::allocator<char>::~allocator(&local_49);
    this_local._7_1_ = 0;
  }
  else {
    cStack_68 = std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::cbegin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)param_2_local);
    level = LOG_STATUS;
    local_6d = 0;
    local_6e = 0;
    local_74 = 0;
    pbVar3 = __gnu_cxx::
             __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator*(&stack0xffffffffffffff98);
    bVar2 = std::operator==(pbVar3,"SEND_ERROR");
    if (bVar2) {
      level = LOG_WARNING;
      local_74 = 1;
      __gnu_cxx::
      __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++(&stack0xffffffffffffff98);
    }
    else {
      pbVar3 = __gnu_cxx::
               __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator*(&stack0xffffffffffffff98);
      bVar2 = std::operator==(pbVar3,"FATAL_ERROR");
      if (bVar2) {
        local_6e = 1;
        level = LOG_WARNING;
        local_74 = 1;
        __gnu_cxx::
        __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::operator++(&stack0xffffffffffffff98);
      }
      else {
        pbVar3 = __gnu_cxx::
                 __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator*(&stack0xffffffffffffff98);
        bVar2 = std::operator==(pbVar3,"WARNING");
        if (bVar2) {
          level = LOG_VERBOSE;
          local_74 = 2;
          __gnu_cxx::
          __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::operator++(&stack0xffffffffffffff98);
        }
        else {
          pbVar3 = __gnu_cxx::
                   __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::operator*(&stack0xffffffffffffff98);
          bVar2 = std::operator==(pbVar3,"AUTHOR_WARNING");
          if (bVar2) {
            pcVar1 = (this->super_cmCommand).Makefile;
            std::allocator<char>::allocator();
            local_c2 = 0;
            local_c3 = 0;
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_98,"CMAKE_SUPPRESS_DEVELOPER_ERRORS",&local_99);
            bVar2 = cmMakefile::IsSet(pcVar1,&local_98);
            local_1e2 = 0;
            if (bVar2) {
              pcVar1 = (this->super_cmCommand).Makefile;
              std::allocator<char>::allocator();
              local_c2 = 1;
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_c0,"CMAKE_SUPPRESS_DEVELOPER_ERRORS",&local_c1);
              local_c3 = 1;
              bVar2 = cmMakefile::IsOn(pcVar1,&local_c0);
              local_1e2 = bVar2 ^ 0xff;
            }
            if ((local_c3 & 1) != 0) {
              std::__cxx11::string::~string((string *)&local_c0);
            }
            if ((local_c2 & 1) != 0) {
              std::allocator<char>::~allocator(&local_c1);
            }
            std::__cxx11::string::~string((string *)&local_98);
            std::allocator<char>::~allocator(&local_99);
            if ((local_1e2 & 1) == 0) {
              pcVar1 = (this->super_cmCommand).Makefile;
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_e8,"CMAKE_SUPPRESS_DEVELOPER_WARNINGS",&local_e9);
              bVar2 = cmMakefile::IsOn(pcVar1,&local_e8);
              std::__cxx11::string::~string((string *)&local_e8);
              std::allocator<char>::~allocator(&local_e9);
              if (((bVar2 ^ 0xffU) & 1) == 0) {
                this_local._7_1_ = 1;
                goto LAB_002690dd;
              }
              level = LOG_UNDEFINED;
              local_74 = 2;
            }
            else {
              local_6e = 1;
              level = LOG_ERROR;
              local_74 = 1;
            }
            __gnu_cxx::
            __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator++(&stack0xffffffffffffff98);
          }
          else {
            pbVar3 = __gnu_cxx::
                     __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     ::operator*(&stack0xffffffffffffff98);
            bVar2 = std::operator==(pbVar3,"STATUS");
            if (bVar2) {
              local_6d = 1;
              local_74 = 4;
              __gnu_cxx::
              __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator++(&stack0xffffffffffffff98);
            }
            else {
              pbVar3 = __gnu_cxx::
                       __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       ::operator*(&stack0xffffffffffffff98);
              bVar2 = std::operator==(pbVar3,"VERBOSE");
              if (bVar2) {
                local_6d = 1;
                local_74 = 5;
                __gnu_cxx::
                __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator++(&stack0xffffffffffffff98);
              }
              else {
                pbVar3 = __gnu_cxx::
                         __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         ::operator*(&stack0xffffffffffffff98);
                bVar2 = std::operator==(pbVar3,"DEBUG");
                if (bVar2) {
                  local_6d = 1;
                  local_74 = 6;
                  __gnu_cxx::
                  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::operator++(&stack0xffffffffffffff98);
                }
                else {
                  pbVar3 = __gnu_cxx::
                           __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           ::operator*(&stack0xffffffffffffff98);
                  bVar2 = std::operator==(pbVar3,"TRACE");
                  if (bVar2) {
                    local_6d = 1;
                    local_74 = 7;
                    __gnu_cxx::
                    __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    ::operator++(&stack0xffffffffffffff98);
                  }
                  else {
                    pbVar3 = __gnu_cxx::
                             __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             ::operator*(&stack0xffffffffffffff98);
                    bVar2 = std::operator==(pbVar3,"DEPRECATION");
                    if (bVar2) {
                      pcVar1 = (this->super_cmCommand).Makefile;
                      std::allocator<char>::allocator();
                      std::__cxx11::string::string<std::allocator<char>>
                                ((string *)&local_110,"CMAKE_ERROR_DEPRECATED",&local_111);
                      bVar2 = cmMakefile::IsOn(pcVar1,&local_110);
                      std::__cxx11::string::~string((string *)&local_110);
                      std::allocator<char>::~allocator(&local_111);
                      if (bVar2) {
                        local_6e = 1;
                        level = LOG_TRACE;
                        local_74 = 1;
                      }
                      else {
                        pcVar1 = (this->super_cmCommand).Makefile;
                        std::allocator<char>::allocator();
                        message.field_2._M_local_buf[0xe] = '\0';
                        message.field_2._M_local_buf[0xd] = '\0';
                        std::__cxx11::string::string<std::allocator<char>>
                                  ((string *)&local_138,"CMAKE_WARN_DEPRECATED",&local_139);
                        bVar2 = cmMakefile::IsSet(pcVar1,&local_138);
                        local_242 = true;
                        if (bVar2) {
                          pcVar1 = (this->super_cmCommand).Makefile;
                          std::allocator<char>::allocator();
                          message.field_2._M_local_buf[0xe] = '\x01';
                          std::__cxx11::string::string<std::allocator<char>>
                                    ((string *)&desiredLevel,"CMAKE_WARN_DEPRECATED",
                                     (allocator<char> *)(message.field_2._M_local_buf + 0xf));
                          message.field_2._M_local_buf[0xd] = '\x01';
                          local_242 = cmMakefile::IsOn(pcVar1,(string *)&desiredLevel);
                        }
                        if ((message.field_2._M_local_buf[0xd] & 1U) != 0) {
                          std::__cxx11::string::~string((string *)&desiredLevel);
                        }
                        if ((message.field_2._M_local_buf[0xe] & 1U) != 0) {
                          std::allocator<char>::~allocator
                                    ((allocator<char> *)(message.field_2._M_local_buf + 0xf));
                        }
                        std::__cxx11::string::~string((string *)&local_138);
                        std::allocator<char>::~allocator(&local_139);
                        if (local_242 == false) {
                          this_local._7_1_ = 1;
                          goto LAB_002690dd;
                        }
                        level = 8;
                        local_74 = 2;
                      }
                      __gnu_cxx::
                      __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      ::operator++(&stack0xffffffffffffff98);
                    }
                    else {
                      pbVar3 = __gnu_cxx::
                               __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                               ::operator*(&stack0xffffffffffffff98);
                      bVar2 = std::operator==(pbVar3,"NOTICE");
                      if (bVar2) {
                        local_74 = 3;
                        __gnu_cxx::
                        __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        ::operator++(&stack0xffffffffffffff98);
                      }
                      else {
                        local_74 = 3;
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
    if (local_74 == 0) {
      __assert_fail("\"Message log level expected to be set\" && level != cmake::LogLevel::LOG_UNDEFINED"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/cmMessageCommand.cxx"
                    ,0x5f,
                    "virtual bool cmMessageCommand::InitialPass(const std::vector<std::string> &, cmExecutionStatus &)"
                   );
    }
    this_00 = cmMakefile::GetCMakeInstance((this->super_cmCommand).Makefile);
    message.field_2._8_4_ = cmake::GetLogLevel(this_00);
    if (message.field_2._8_4_ == LOG_UNDEFINED) {
      __assert_fail("\"Expected a valid log level here\" && desiredLevel != cmake::LogLevel::LOG_UNDEFINED"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/cmMessageCommand.cxx"
                    ,99,
                    "virtual bool cmMessageCommand::InitialPass(const std::vector<std::string> &, cmExecutionStatus &)"
                   );
    }
    if ((int)message.field_2._8_4_ < local_74) {
      this_local._7_1_ = 1;
    }
    else {
      local_1a0._M_current = cStack_68._M_current;
      m = (cmMessenger *)
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::cend((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)param_2_local);
      local_198 = cmMakeRange<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                            (local_1a0,
                             (__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                              )m);
      cmJoin<cmRange<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>>
                ((string *)local_188,&local_198,"");
      if (level == LOG_STATUS) {
        if ((local_6d & 1) == 0) {
          cmSystemTools::Message((string *)local_188,(char *)0x0);
        }
        else {
          cmMakefile::DisplayStatus((this->super_cmCommand).Makefile,(string *)local_188,-1.0);
        }
      }
      else {
        this_01 = cmMakefile::GetMessenger((this->super_cmCommand).Makefile);
        t = level;
        local_1c0._16_8_ = this_01;
        cmMakefile::GetBacktrace((cmMakefile *)local_1c0);
        cmMessenger::DisplayMessage(this_01,t,(string *)local_188,(cmListFileBacktrace *)local_1c0);
        cmListFileBacktrace::~cmListFileBacktrace((cmListFileBacktrace *)local_1c0);
      }
      if ((local_6e & 1) != 0) {
        cmSystemTools::SetFatalErrorOccured();
      }
      this_local._7_1_ = 1;
      std::__cxx11::string::~string((string *)local_188);
    }
  }
LAB_002690dd:
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool cmMessageCommand::InitialPass(std::vector<std::string> const& args,
                                   cmExecutionStatus&)
{
  if (args.empty()) {
    this->SetError("called with incorrect number of arguments");
    return false;
  }
  auto i = args.cbegin();

  auto type = MessageType::MESSAGE;
  auto status = false;
  auto fatal = false;
  auto level = cmake::LogLevel::LOG_UNDEFINED;
  if (*i == "SEND_ERROR") {
    type = MessageType::FATAL_ERROR;
    level = cmake::LogLevel::LOG_ERROR;
    ++i;
  } else if (*i == "FATAL_ERROR") {
    fatal = true;
    type = MessageType::FATAL_ERROR;
    level = cmake::LogLevel::LOG_ERROR;
    ++i;
  } else if (*i == "WARNING") {
    type = MessageType::WARNING;
    level = cmake::LogLevel::LOG_WARNING;
    ++i;
  } else if (*i == "AUTHOR_WARNING") {
    if (this->Makefile->IsSet("CMAKE_SUPPRESS_DEVELOPER_ERRORS") &&
        !this->Makefile->IsOn("CMAKE_SUPPRESS_DEVELOPER_ERRORS")) {
      fatal = true;
      type = MessageType::AUTHOR_ERROR;
      level = cmake::LogLevel::LOG_ERROR;
    } else if (!this->Makefile->IsOn("CMAKE_SUPPRESS_DEVELOPER_WARNINGS")) {
      type = MessageType::AUTHOR_WARNING;
      level = cmake::LogLevel::LOG_WARNING;
    } else {
      return true;
    }
    ++i;
  } else if (*i == "STATUS") {
    status = true;
    level = cmake::LogLevel::LOG_STATUS;
    ++i;
  } else if (*i == "VERBOSE") {
    status = true;
    level = cmake::LogLevel::LOG_VERBOSE;
    ++i;
  } else if (*i == "DEBUG") {
    status = true;
    level = cmake::LogLevel::LOG_DEBUG;
    ++i;
  } else if (*i == "TRACE") {
    status = true;
    level = cmake::LogLevel::LOG_TRACE;
    ++i;
  } else if (*i == "DEPRECATION") {
    if (this->Makefile->IsOn("CMAKE_ERROR_DEPRECATED")) {
      fatal = true;
      type = MessageType::DEPRECATION_ERROR;
      level = cmake::LogLevel::LOG_ERROR;
    } else if ((!this->Makefile->IsSet("CMAKE_WARN_DEPRECATED") ||
                this->Makefile->IsOn("CMAKE_WARN_DEPRECATED"))) {
      type = MessageType::DEPRECATION_WARNING;
      level = cmake::LogLevel::LOG_WARNING;
    } else {
      return true;
    }
    ++i;
  } else if (*i == "NOTICE") {
    // `NOTICE` message type is going to be output to stderr
    level = cmake::LogLevel::LOG_NOTICE;
    ++i;
  } else {
    // Messages w/o any type are `NOTICE`s
    level = cmake::LogLevel::LOG_NOTICE;
  }
  assert("Message log level expected to be set" &&
         level != cmake::LogLevel::LOG_UNDEFINED);

  auto desiredLevel = this->Makefile->GetCMakeInstance()->GetLogLevel();
  assert("Expected a valid log level here" &&
         desiredLevel != cmake::LogLevel::LOG_UNDEFINED);

  if (desiredLevel < level) {
    // Suppress the message
    return true;
  }

  auto message = cmJoin(cmMakeRange(i, args.cend()), "");

  if (type != MessageType::MESSAGE) {
    // we've overridden the message type, above, so display it directly
    cmMessenger* m = this->Makefile->GetMessenger();
    m->DisplayMessage(type, message, this->Makefile->GetBacktrace());
  } else {
    if (status) {
      this->Makefile->DisplayStatus(message, -1);
    } else {
      cmSystemTools::Message(message);
    }
  }
  if (fatal) {
    cmSystemTools::SetFatalErrorOccured();
  }
  return true;
}